

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

ssize_t bgzf_raw_read(BGZF *fp,void *data,size_t length)

{
  ssize_t sVar1;
  size_t length_local;
  void *data_local;
  BGZF *fp_local;
  
  sVar1 = hread(fp->fp,data,length);
  return sVar1;
}

Assistant:

ssize_t bgzf_raw_read(BGZF *fp, void *data, size_t length)
{
    return hread(fp->fp, data, length);
}